

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

int char2hex(char c)

{
  undefined4 local_c;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('F' < c)) {
      if (c == '.') {
        local_c = -2;
      }
      else {
        local_c = -1;
      }
    }
    else {
      local_c = c + -0x37;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static inline int char2hex(char c)
{
    if (c >= '0' && c <= '9')
        return c - '0';
    if (c >= 'A' && c <= 'F')
        return c - 'A' + 10;
    if (c == '.')
        return -2;
    return -1;
}